

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

_Bool Hacl_Impl_P256_DH_ecp256dh_r
                (uint8_t *shared_secret,uint8_t *their_pubkey,uint8_t *private_key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  _Bool _Var87;
  uint uVar88;
  uint64_t uVar89;
  uint64_t uVar90;
  uint64_t uVar91;
  uint64_t uVar92;
  ulong uVar93;
  uint64_t uVar94;
  uint64_t uVar95;
  sbyte sVar96;
  long lVar97;
  uint uVar98;
  uint64_t *puVar99;
  undefined8 *puVar100;
  uint uVar101;
  uint64_t *puVar102;
  undefined8 *puVar103;
  uint64_t *t11;
  ulong uVar104;
  uint64_t *t11_1;
  ulong uVar105;
  ulong uVar106;
  uint64_t *t11_2;
  ulong uVar107;
  uint64_t t1;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  byte bVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  uint64_t tmp [12];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  undefined1 local_d38 [16];
  undefined1 local_d28 [16];
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  uint64_t local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  uint64_t local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  uint64_t local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  uint64_t local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  uint64_t local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  uint64_t local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  uint64_t local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  uint64_t local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  uint64_t local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  uint64_t local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  uint64_t local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  uint64_t local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  uint64_t local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  uint64_t local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  uint64_t local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  ulong local_718 [4];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  uint64_t local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  uint64_t local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  uint64_t local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  uint64_t local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  uint64_t local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  uint64_t local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  uint64_t local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  uint64_t local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint64_t local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  uint64_t local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint64_t local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  uint64_t local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  uint64_t local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  uint64_t local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint64_t local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar111 = 0;
  local_6a8 = (undefined1  [16])0x0;
  local_6b8 = (undefined1  [16])0x0;
  local_6c8 = (undefined1  [16])0x0;
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_6f8 = (undefined1  [16])0x0;
  _Var87 = load_point_vartime((uint64_t *)local_6f8,their_pubkey);
  uVar93 = *(ulong *)(private_key + 0x18);
  uVar108 = uVar93 >> 0x38 | (uVar93 & 0xff000000000000) >> 0x28 | (uVar93 & 0xff0000000000) >> 0x18
            | (uVar93 & 0xff00000000) >> 8 | (uVar93 & 0xff000000) << 8 |
            (uVar93 & 0xff0000) << 0x18 | (uVar93 & 0xff00) << 0x28 | uVar93 << 0x38;
  uVar93 = *(ulong *)(private_key + 0x10);
  uVar104 = uVar93 >> 0x38 | (uVar93 & 0xff000000000000) >> 0x28 | (uVar93 & 0xff0000000000) >> 0x18
            | (uVar93 & 0xff00000000) >> 8 | (uVar93 & 0xff000000) << 8 |
            (uVar93 & 0xff0000) << 0x18 | (uVar93 & 0xff00) << 0x28 | uVar93 << 0x38;
  uVar93 = *(ulong *)private_key;
  uVar105 = *(ulong *)(private_key + 8);
  uVar105 = uVar105 >> 0x38 | (uVar105 & 0xff000000000000) >> 0x28 |
            (uVar105 & 0xff0000000000) >> 0x18 | (uVar105 & 0xff00000000) >> 8 |
            (uVar105 & 0xff000000) << 8 | (uVar105 & 0xff0000) << 0x18 | (uVar105 & 0xff00) << 0x28
            | uVar105 << 0x38;
  uVar107 = uVar93 >> 0x38 | (uVar93 & 0xff000000000000) >> 0x28 | (uVar93 & 0xff0000000000) >> 0x18
            | (uVar93 & 0xff00000000) >> 8 | (uVar93 & 0xff000000) << 8 |
            (uVar93 & 0xff0000) << 0x18 | (uVar93 & 0xff00) << 0x28 | uVar93 << 0x38;
  uVar89 = FStar_UInt64_eq_mask(uVar108,0);
  uVar90 = FStar_UInt64_eq_mask(uVar104,0);
  uVar91 = FStar_UInt64_eq_mask(uVar105,0);
  uVar92 = FStar_UInt64_eq_mask(uVar107,0);
  uVar93 = ~(uVar92 & uVar91 & uVar90 & uVar89) &
           -(ulong)(uVar107 < 0xffffffff00000000 ||
                   uVar107 + 0x100000000 <
                   (ulong)(uVar105 != 0xffffffffffffffff ||
                          uVar105 + 1 <
                          (ulong)(uVar104 < 0xbce6faada7179e84 ||
                                 uVar104 + 0x4319055258e8617c <
                                 (ulong)(uVar108 < 0xf3b9cac2fc632551))));
  local_718[0] = (uVar108 ^ 1) & uVar93 ^ 1;
  local_718[1] = uVar104 & uVar93;
  local_718[2] = uVar105 & uVar93;
  local_718[3] = uVar107 & uVar93;
  if (_Var87) {
    memset(&local_5d8,0,0x540);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_698 = (undefined1  [16])0x0;
    local_688 = (undefined1  [16])0x0;
    local_678 = 1;
    local_670 = 0xffffffff00000000;
    local_668 = 0xffffffffffffffff;
    local_660 = 0xfffffffe;
    local_658 = (undefined1  [16])0x0;
    local_648 = (undefined1  [16])0x0;
    puVar99 = (uint64_t *)local_6f8;
    puVar102 = &local_638;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_638);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_5d8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_5d8);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_578;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_5d8);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_518;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_518);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_4b8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_578);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_458;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_458);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_3f8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_518);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_398;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_398);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_338;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_4b8);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_2d8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_2d8);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_278;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_458);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_218;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_218);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_1b8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_double((uint64_t *)local_98,&local_3f8);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_158;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    point_add((uint64_t *)local_98,(uint64_t *)local_6f8,&local_158);
    puVar99 = (uint64_t *)local_98;
    puVar102 = &local_f8;
    for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
      *puVar102 = *puVar99;
      puVar99 = puVar99 + (ulong)bVar111 * -2 + 1;
      puVar102 = puVar102 + (ulong)bVar111 * -2 + 1;
    }
    local_768 = (undefined1  [16])0x0;
    local_778 = (undefined1  [16])0x0;
    local_758 = 1;
    local_750 = 0xffffffff00000000;
    local_748 = 0xffffffffffffffff;
    local_740 = 0xfffffffe;
    local_738 = (undefined1  [16])0x0;
    local_728 = (undefined1  [16])0x0;
    local_788 = local_638;
    uStack_780 = uStack_630;
    local_798 = local_628;
    uStack_790 = uStack_620;
    local_7a8 = local_618;
    uStack_7a0 = uStack_610;
    local_7b8 = local_608;
    uStack_7b0 = uStack_600;
    local_7c8 = local_5c8;
    uStack_7c0 = uStack_5c0;
    local_7d8 = local_5d8;
    uStack_7d0 = uStack_5d0;
    local_7e8 = local_568;
    uStack_7e0 = uStack_560;
    local_7f8 = local_578;
    uStack_7f0 = uStack_570;
    local_808 = local_5a8;
    uStack_800 = uStack_5a0;
    local_818 = local_5b8;
    uStack_810 = uStack_5b0;
    local_828 = local_548;
    uStack_820 = uStack_540;
    local_838 = local_558;
    uStack_830 = uStack_550;
    local_848 = local_5e8;
    uStack_840 = uStack_5e0;
    local_858 = local_5f8;
    uStack_850 = uStack_5f0;
    local_868 = local_588;
    uStack_860 = uStack_580;
    local_878 = local_598;
    uStack_870 = uStack_590;
    uVar98 = 0xfc;
    local_888 = local_508;
    uStack_880 = uStack_500;
    local_898 = local_518;
    uStack_890 = uStack_510;
    local_8a8 = local_4e8;
    uStack_8a0 = uStack_4e0;
    local_8b8 = local_4f8;
    uStack_8b0 = uStack_4f0;
    local_8c8 = local_528;
    uStack_8c0 = uStack_520;
    local_8d8 = local_538;
    uStack_8d0 = uStack_530;
    local_8e8 = local_4c8;
    uStack_8e0 = uStack_4c0;
    local_8f8 = local_4d8;
    uStack_8f0 = uStack_4d0;
    local_908 = local_4a8;
    uStack_900 = uStack_4a0;
    local_918 = local_4b8;
    uStack_910 = uStack_4b0;
    local_928 = local_488;
    uStack_920 = uStack_480;
    local_938 = local_498;
    uStack_930 = uStack_490;
    local_948 = local_448;
    uStack_940 = uStack_440;
    local_958 = local_458;
    uStack_950 = uStack_450;
    local_968 = local_428;
    uStack_960 = uStack_420;
    local_978 = local_438;
    uStack_970 = uStack_430;
    local_988 = local_468;
    uStack_980 = uStack_460;
    local_998 = local_478;
    uStack_990 = uStack_470;
    local_9a8 = local_3e8;
    uStack_9a0 = uStack_3e0;
    local_9b8 = local_3f8;
    uStack_9b0 = uStack_3f0;
    local_9c8 = local_3c8;
    uStack_9c0 = uStack_3c0;
    local_9d8 = local_3d8;
    uStack_9d0 = uStack_3d0;
    local_9e8 = local_408;
    uStack_9e0 = uStack_400;
    local_9f8 = local_418;
    uStack_9f0 = uStack_410;
    local_a08 = local_388;
    uStack_a00 = uStack_380;
    local_a18 = local_398;
    uStack_a10 = uStack_390;
    local_a28 = local_368;
    uStack_a20 = uStack_360;
    local_a38 = local_378;
    uStack_a30 = uStack_370;
    local_a48 = local_3a8;
    uStack_a40 = uStack_3a0;
    local_a58 = local_3b8;
    uStack_a50 = uStack_3b0;
    local_a68 = local_328;
    uStack_a60 = uStack_320;
    local_a78 = local_338;
    uStack_a70 = uStack_330;
    local_a88 = local_308;
    uStack_a80 = uStack_300;
    local_a98 = local_318;
    uStack_a90 = uStack_310;
    local_aa8 = local_348;
    uStack_aa0 = uStack_340;
    local_ab8 = local_358;
    uStack_ab0 = uStack_350;
    local_ac8 = local_2e8;
    uStack_ac0 = uStack_2e0;
    local_ad8 = local_2f8;
    uStack_ad0 = uStack_2f0;
    local_ae8 = local_2c8;
    uStack_ae0 = uStack_2c0;
    local_af8 = local_2d8;
    uStack_af0 = uStack_2d0;
    local_b08 = local_2a8;
    uStack_b00 = uStack_2a0;
    local_b18 = local_2b8;
    uStack_b10 = uStack_2b0;
    local_b28 = local_288;
    uStack_b20 = uStack_280;
    local_b38 = local_298;
    uStack_b30 = uStack_290;
    local_b48 = local_268;
    uStack_b40 = uStack_260;
    local_b58 = local_278;
    uStack_b50 = uStack_270;
    local_b68 = local_248;
    uStack_b60 = uStack_240;
    local_b78 = local_258;
    uStack_b70 = uStack_250;
    local_b88 = local_208;
    uStack_b80 = uStack_200;
    local_b98 = local_218;
    uStack_b90 = uStack_210;
    local_ba8 = local_1e8;
    uStack_ba0 = uStack_1e0;
    local_bb8 = local_1f8;
    uStack_bb0 = uStack_1f0;
    local_bc8 = local_228;
    uStack_bc0 = uStack_220;
    local_bd8 = local_238;
    uStack_bd0 = uStack_230;
    local_be8 = local_1a8;
    uStack_be0 = uStack_1a0;
    local_bf8 = local_1b8;
    uStack_bf0 = uStack_1b0;
    local_c08 = local_188;
    uStack_c00 = uStack_180;
    local_c18 = local_198;
    uStack_c10 = uStack_190;
    local_c28 = local_1c8;
    uStack_c20 = uStack_1c0;
    local_c38 = local_1d8;
    uStack_c30 = uStack_1d0;
    local_c48 = local_148;
    uStack_c40 = uStack_140;
    local_c58 = local_158;
    uStack_c50 = uStack_150;
    local_c68 = local_e8;
    uStack_c60 = uStack_e0;
    local_c78 = local_f8;
    uStack_c70 = uStack_f0;
    local_c88 = local_128;
    uStack_c80 = uStack_120;
    local_c98 = local_138;
    uStack_c90 = uStack_130;
    local_ca8 = local_c8;
    uStack_ca0 = uStack_c0;
    local_cb8 = local_d8;
    uStack_cb0 = uStack_d0;
    local_cc8 = local_168;
    uStack_cc0 = uStack_160;
    local_cd8 = local_178;
    uStack_cd0 = uStack_170;
    local_ce8 = local_108;
    uStack_ce0 = uStack_100;
    local_cf8 = local_118;
    uStack_cf0 = uStack_110;
    local_d08 = local_a8;
    uStack_d00 = uStack_a0;
    local_d18 = local_b8;
    uStack_d10 = uStack_b0;
    do {
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      point_double((uint64_t *)local_778,(uint64_t *)local_778);
      uVar88 = uVar98 >> 6;
      sVar96 = (sbyte)(uVar98 & 0x3c);
      uVar101 = (uint)(local_718[uVar88] >> sVar96);
      if ((uVar98 & 0x3c) != 0 && uVar88 != 3) {
        uVar101 = uVar101 | (uint)(local_718[(ulong)uVar88 + 1] << (-sVar96 & 0x3fU));
      }
      uVar105 = (ulong)(uVar101 & 0xf);
      puVar100 = (undefined8 *)local_698;
      puVar103 = (undefined8 *)local_d78;
      for (lVar97 = 0xc; lVar97 != 0; lVar97 = lVar97 + -1) {
        *puVar103 = *puVar100;
        puVar100 = puVar100 + (ulong)bVar111 * -2 + 1;
        puVar103 = puVar103 + (ulong)bVar111 * -2 + 1;
      }
      uVar89 = FStar_UInt64_eq_mask(uVar105,1);
      uVar108 = ~uVar89;
      uVar90 = FStar_UInt64_eq_mask(uVar105,2);
      uVar107 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar105,3);
      uVar109 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar105,4);
      uVar104 = ~uVar92;
      auVar115._8_4_ = (int)uVar89;
      auVar115._0_8_ = uVar89;
      auVar115._12_4_ = (int)(uVar89 >> 0x20);
      auVar85._8_8_ = uStack_790;
      auVar85._0_8_ = local_798;
      auVar86._8_8_ = uStack_780;
      auVar86._0_8_ = local_788;
      auVar145._8_4_ = (int)uVar108;
      auVar145._0_8_ = uVar108;
      auVar145._12_4_ = (int)(uVar108 >> 0x20);
      auVar139 = local_d68 & auVar145;
      auVar135 = local_d78 & auVar145;
      auVar121._8_4_ = (int)uVar90;
      auVar121._0_8_ = uVar90;
      auVar121._12_4_ = (int)(uVar90 >> 0x20);
      auVar82._8_8_ = uStack_7c0;
      auVar82._0_8_ = local_7c8;
      auVar81._8_8_ = uStack_7d0;
      auVar81._0_8_ = local_7d8;
      auVar130._8_4_ = (int)uVar107;
      auVar130._0_8_ = uVar107;
      auVar130._12_4_ = (int)(uVar107 >> 0x20);
      auVar118._8_4_ = (int)uVar91;
      auVar118._0_8_ = uVar91;
      auVar118._12_4_ = (int)(uVar91 >> 0x20);
      auVar80._8_8_ = uStack_7e0;
      auVar80._0_8_ = local_7e8;
      auVar79._8_8_ = uStack_7f0;
      auVar79._0_8_ = local_7f8;
      auVar127._8_4_ = (int)uVar109;
      auVar127._0_8_ = uVar109;
      auVar127._12_4_ = (int)(uVar109 >> 0x20);
      auVar112._8_4_ = (int)uVar92;
      auVar112._0_8_ = uVar92;
      auVar112._12_4_ = (int)(uVar92 >> 0x20);
      auVar70._8_8_ = uStack_880;
      auVar70._0_8_ = local_888;
      auVar69._8_8_ = uStack_890;
      auVar69._0_8_ = local_898;
      auVar124._8_4_ = (int)uVar104;
      auVar124._0_8_ = uVar104;
      auVar124._12_4_ = (int)(uVar104 >> 0x20);
      auVar83._8_8_ = uStack_7b0;
      auVar83._0_8_ = local_7b8;
      auVar84._8_8_ = uStack_7a0;
      auVar84._0_8_ = local_7a8;
      auVar140 = local_d48 & auVar145;
      auVar143 = local_d58 & auVar145;
      auVar78._8_8_ = uStack_800;
      auVar78._0_8_ = local_808;
      auVar77._8_8_ = uStack_810;
      auVar77._0_8_ = local_818;
      auVar76._8_8_ = uStack_820;
      auVar76._0_8_ = local_828;
      auVar75._8_8_ = uStack_830;
      auVar75._0_8_ = local_838;
      auVar68._8_8_ = uStack_8a0;
      auVar68._0_8_ = local_8a8;
      auVar67._8_8_ = uStack_8b0;
      auVar67._0_8_ = local_8b8;
      auVar74._8_8_ = uStack_840;
      auVar74._0_8_ = local_848;
      auVar136 = local_d28 & auVar145;
      auVar73._8_8_ = uStack_850;
      auVar73._0_8_ = local_858;
      auVar145 = auVar145 & local_d38;
      auVar72._8_8_ = uStack_860;
      auVar72._0_8_ = local_868;
      auVar71._8_8_ = uStack_870;
      auVar71._0_8_ = local_878;
      auVar66._8_8_ = uStack_8c0;
      auVar66._0_8_ = local_8c8;
      auVar65._8_8_ = uStack_8d0;
      auVar65._0_8_ = local_8d8;
      auVar64._8_8_ = uStack_8e0;
      auVar64._0_8_ = local_8e8;
      auVar63._8_8_ = uStack_8f0;
      auVar63._0_8_ = local_8f8;
      uVar89 = FStar_UInt64_eq_mask(uVar105,5);
      uVar110 = ~uVar89;
      uVar90 = FStar_UInt64_eq_mask(uVar105,6);
      uVar108 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar105,7);
      uVar106 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar105,8);
      uVar109 = ~uVar92;
      uVar94 = FStar_UInt64_eq_mask(uVar105,9);
      uVar107 = ~uVar94;
      uVar95 = FStar_UInt64_eq_mask(uVar105,10);
      uVar104 = ~uVar95;
      auVar113._8_4_ = (int)uVar95;
      auVar113._0_8_ = uVar95;
      auVar113._12_4_ = (int)(uVar95 >> 0x20);
      auVar32._8_8_ = uStack_ae0;
      auVar32._0_8_ = local_ae8;
      auVar116._8_4_ = (int)uVar89;
      auVar116._0_8_ = uVar89;
      auVar116._12_4_ = (int)(uVar89 >> 0x20);
      auVar62._8_8_ = uStack_900;
      auVar62._0_8_ = local_908;
      auVar61._8_8_ = uStack_910;
      auVar61._0_8_ = local_918;
      auVar125._8_4_ = (int)uVar110;
      auVar125._0_8_ = uVar110;
      auVar125._12_4_ = (int)(uVar110 >> 0x20);
      auVar119._8_4_ = (int)uVar90;
      auVar119._0_8_ = uVar90;
      auVar119._12_4_ = (int)(uVar90 >> 0x20);
      auVar58._8_8_ = uStack_940;
      auVar58._0_8_ = local_948;
      auVar57._8_8_ = uStack_950;
      auVar57._0_8_ = local_958;
      auVar131._8_4_ = (int)uVar108;
      auVar131._0_8_ = uVar108;
      auVar131._12_4_ = (int)(uVar108 >> 0x20);
      auVar122._8_4_ = (int)uVar91;
      auVar122._0_8_ = uVar91;
      auVar122._12_4_ = (int)(uVar91 >> 0x20);
      auVar52._8_8_ = uStack_9a0;
      auVar52._0_8_ = local_9a8;
      auVar51._8_8_ = uStack_9b0;
      auVar51._0_8_ = local_9b8;
      auVar137._8_4_ = (int)uVar106;
      auVar137._0_8_ = uVar106;
      auVar137._12_4_ = (int)(uVar106 >> 0x20);
      auVar128._8_4_ = (int)uVar92;
      auVar128._0_8_ = uVar92;
      auVar128._12_4_ = (int)(uVar92 >> 0x20);
      auVar46._8_8_ = uStack_a00;
      auVar46._0_8_ = local_a08;
      auVar45._8_8_ = uStack_a10;
      auVar45._0_8_ = local_a18;
      auVar141._8_4_ = (int)uVar109;
      auVar141._0_8_ = uVar109;
      auVar141._12_4_ = (int)(uVar109 >> 0x20);
      auVar133._8_4_ = (int)uVar94;
      auVar133._0_8_ = uVar94;
      auVar133._12_4_ = (int)(uVar94 >> 0x20);
      auVar40._8_8_ = uStack_a60;
      auVar40._0_8_ = local_a68;
      auVar144._8_4_ = (int)uVar107;
      auVar144._0_8_ = uVar107;
      auVar144._12_4_ = (int)(uVar107 >> 0x20);
      auVar39._8_8_ = uStack_a70;
      auVar39._0_8_ = local_a78;
      auVar146._8_4_ = (int)uVar104;
      auVar146._0_8_ = uVar104;
      auVar146._12_4_ = (int)(uVar104 >> 0x20);
      auVar31._8_8_ = uStack_af0;
      auVar31._0_8_ = local_af8;
      auVar60._8_8_ = uStack_920;
      auVar60._0_8_ = local_928;
      auVar59._8_8_ = uStack_930;
      auVar59._0_8_ = local_938;
      auVar56._8_8_ = uStack_960;
      auVar56._0_8_ = local_968;
      auVar55._8_8_ = uStack_970;
      auVar55._0_8_ = local_978;
      auVar50._8_8_ = uStack_9c0;
      auVar50._0_8_ = local_9c8;
      auVar49._8_8_ = uStack_9d0;
      auVar49._0_8_ = local_9d8;
      auVar44._8_8_ = uStack_a20;
      auVar44._0_8_ = local_a28;
      auVar43._8_8_ = uStack_a30;
      auVar43._0_8_ = local_a38;
      auVar38._8_8_ = uStack_a80;
      auVar38._0_8_ = local_a88;
      auVar37._8_8_ = uStack_a90;
      auVar37._0_8_ = local_a98;
      auVar30._8_8_ = uStack_b00;
      auVar30._0_8_ = local_b08;
      auVar29._8_8_ = uStack_b10;
      auVar29._0_8_ = local_b18;
      auVar54._8_8_ = uStack_980;
      auVar54._0_8_ = local_988;
      auVar53._8_8_ = uStack_990;
      auVar53._0_8_ = local_998;
      auVar48._8_8_ = uStack_9e0;
      auVar48._0_8_ = local_9e8;
      auVar47._8_8_ = uStack_9f0;
      auVar47._0_8_ = local_9f8;
      auVar42._8_8_ = uStack_a40;
      auVar42._0_8_ = local_a48;
      auVar41._8_8_ = uStack_a50;
      auVar41._0_8_ = local_a58;
      auVar36._8_8_ = uStack_aa0;
      auVar36._0_8_ = local_aa8;
      auVar35._8_8_ = uStack_ab0;
      auVar35._0_8_ = local_ab8;
      auVar34._8_8_ = uStack_ac0;
      auVar34._0_8_ = local_ac8;
      auVar33._8_8_ = uStack_ad0;
      auVar33._0_8_ = local_ad8;
      auVar28._8_8_ = uStack_b20;
      auVar28._0_8_ = local_b28;
      auVar27._8_8_ = uStack_b30;
      auVar27._0_8_ = local_b38;
      uVar89 = FStar_UInt64_eq_mask(uVar105,0xb);
      uVar107 = ~uVar89;
      uVar90 = FStar_UInt64_eq_mask(uVar105,0xc);
      uVar104 = ~uVar90;
      uVar91 = FStar_UInt64_eq_mask(uVar105,0xd);
      uVar108 = ~uVar91;
      uVar92 = FStar_UInt64_eq_mask(uVar105,0xe);
      uVar109 = ~uVar92;
      uVar94 = FStar_UInt64_eq_mask(uVar105,0xf);
      uVar105 = ~uVar94;
      auVar126._8_4_ = (int)uVar89;
      auVar126._0_8_ = uVar89;
      auVar126._12_4_ = (int)(uVar89 >> 0x20);
      auVar26._8_8_ = uStack_b40;
      auVar26._0_8_ = local_b48;
      auVar25._8_8_ = uStack_b50;
      auVar25._0_8_ = local_b58;
      auVar142._8_4_ = (int)uVar107;
      auVar142._0_8_ = uVar107;
      auVar142._12_4_ = (int)(uVar107 >> 0x20);
      auVar123._8_4_ = (int)uVar90;
      auVar123._0_8_ = uVar90;
      auVar123._12_4_ = (int)(uVar90 >> 0x20);
      auVar22._8_8_ = uStack_b80;
      auVar22._0_8_ = local_b88;
      auVar21._8_8_ = uStack_b90;
      auVar21._0_8_ = local_b98;
      auVar138._8_4_ = (int)uVar104;
      auVar138._0_8_ = uVar104;
      auVar138._12_4_ = (int)(uVar104 >> 0x20);
      auVar120._8_4_ = (int)uVar91;
      auVar120._0_8_ = uVar91;
      auVar120._12_4_ = (int)(uVar91 >> 0x20);
      auVar16._8_8_ = uStack_be0;
      auVar16._0_8_ = local_be8;
      auVar15._8_8_ = uStack_bf0;
      auVar15._0_8_ = local_bf8;
      auVar134._8_4_ = (int)uVar108;
      auVar134._0_8_ = uVar108;
      auVar134._12_4_ = (int)(uVar108 >> 0x20);
      auVar117._8_4_ = (int)uVar92;
      auVar117._0_8_ = uVar92;
      auVar117._12_4_ = (int)(uVar92 >> 0x20);
      auVar10._8_8_ = uStack_c40;
      auVar10._0_8_ = local_c48;
      auVar129._8_4_ = (int)uVar109;
      auVar129._0_8_ = uVar109;
      auVar129._12_4_ = (int)(uVar109 >> 0x20);
      auVar9._8_8_ = uStack_c50;
      auVar9._0_8_ = local_c58;
      auVar114._8_4_ = (int)uVar94;
      auVar114._0_8_ = uVar94;
      auVar114._12_4_ = (int)(uVar94 >> 0x20);
      auVar8._8_8_ = uStack_c60;
      auVar8._0_8_ = local_c68;
      auVar132._8_4_ = (int)uVar105;
      auVar132._0_8_ = uVar105;
      auVar132._12_4_ = (int)(uVar105 >> 0x20);
      local_d68 = ((((((((((((((auVar139 | auVar115 & auVar85) & auVar130 | auVar121 & auVar82) &
                              auVar127 | auVar118 & auVar80) & auVar124 | auVar112 & auVar70) &
                            auVar125 | auVar116 & auVar62) & auVar131 | auVar119 & auVar58) &
                          auVar137 | auVar122 & auVar52) & auVar141 | auVar128 & auVar46) & auVar144
                       | auVar40 & auVar133) & auVar146 | auVar32 & auVar113) & auVar142 |
                     auVar26 & auVar126) & auVar138 | auVar22 & auVar123) & auVar134 |
                   auVar16 & auVar120) & auVar129 | auVar10 & auVar117) & auVar132 |
                  auVar8 & auVar114;
      auVar7._8_8_ = uStack_c70;
      auVar7._0_8_ = local_c78;
      local_d78 = ((((((((((((((auVar135 | auVar115 & auVar86) & auVar130 | auVar121 & auVar81) &
                              auVar127 | auVar118 & auVar79) & auVar124 | auVar112 & auVar69) &
                            auVar125 | auVar116 & auVar61) & auVar131 | auVar119 & auVar57) &
                          auVar137 | auVar122 & auVar51) & auVar141 | auVar128 & auVar45) & auVar144
                       | auVar39 & auVar133) & auVar146 | auVar31 & auVar113) & auVar142 |
                     auVar25 & auVar126) & auVar138 | auVar21 & auVar123) & auVar134 |
                   auVar15 & auVar120) & auVar129 | auVar9 & auVar117) & auVar132 |
                  auVar7 & auVar114;
      auVar24._8_8_ = uStack_b60;
      auVar24._0_8_ = local_b68;
      auVar23._8_8_ = uStack_b70;
      auVar23._0_8_ = local_b78;
      auVar20._8_8_ = uStack_ba0;
      auVar20._0_8_ = local_ba8;
      auVar19._8_8_ = uStack_bb0;
      auVar19._0_8_ = local_bb8;
      auVar14._8_8_ = uStack_c00;
      auVar14._0_8_ = local_c08;
      auVar13._8_8_ = uStack_c10;
      auVar13._0_8_ = local_c18;
      auVar6._8_8_ = uStack_c80;
      auVar6._0_8_ = local_c88;
      auVar5._8_8_ = uStack_c90;
      auVar5._0_8_ = local_c98;
      auVar4._8_8_ = uStack_ca0;
      auVar4._0_8_ = local_ca8;
      local_d48 = ((((((((((((((auVar140 | auVar115 & auVar83) & auVar130 | auVar121 & auVar78) &
                              auVar127 | auVar118 & auVar76) & auVar124 | auVar112 & auVar68) &
                            auVar125 | auVar116 & auVar60) & auVar131 | auVar119 & auVar56) &
                          auVar137 | auVar122 & auVar50) & auVar141 | auVar44 & auVar128) & auVar144
                       | auVar38 & auVar133) & auVar146 | auVar30 & auVar113) & auVar142 |
                     auVar24 & auVar126) & auVar138 | auVar20 & auVar123) & auVar134 |
                   auVar14 & auVar120) & auVar129 | auVar6 & auVar117) & auVar132 |
                  auVar4 & auVar114;
      auVar3._8_8_ = uStack_cb0;
      auVar3._0_8_ = local_cb8;
      local_d58 = ((((((((((((((auVar143 | auVar115 & auVar84) & auVar130 | auVar121 & auVar77) &
                              auVar127 | auVar118 & auVar75) & auVar124 | auVar112 & auVar67) &
                            auVar125 | auVar116 & auVar59) & auVar131 | auVar119 & auVar55) &
                          auVar137 | auVar122 & auVar49) & auVar141 | auVar43 & auVar128) & auVar144
                       | auVar37 & auVar133) & auVar146 | auVar29 & auVar113) & auVar142 |
                     auVar23 & auVar126) & auVar138 | auVar19 & auVar123) & auVar134 |
                   auVar13 & auVar120) & auVar129 | auVar5 & auVar117) & auVar132 |
                  auVar3 & auVar114;
      auVar18._8_8_ = uStack_bc0;
      auVar18._0_8_ = local_bc8;
      auVar17._8_8_ = uStack_bd0;
      auVar17._0_8_ = local_bd8;
      auVar12._8_8_ = uStack_c20;
      auVar12._0_8_ = local_c28;
      auVar11._8_8_ = uStack_c30;
      auVar11._0_8_ = local_c38;
      auVar2._8_8_ = uStack_cc0;
      auVar2._0_8_ = local_cc8;
      auVar1._8_8_ = uStack_cd0;
      auVar1._0_8_ = local_cd8;
      auVar143._8_8_ = uStack_ce0;
      auVar143._0_8_ = local_ce8;
      auVar140._8_8_ = uStack_cf0;
      auVar140._0_8_ = local_cf8;
      auVar139._8_8_ = uStack_d00;
      auVar139._0_8_ = local_d08;
      local_d28 = ((((((((((((((auVar136 | auVar115 & auVar74) & auVar130 | auVar121 & auVar72) &
                              auVar127 | auVar118 & auVar66) & auVar124 | auVar112 & auVar64) &
                            auVar125 | auVar116 & auVar54) & auVar131 | auVar119 & auVar48) &
                          auVar137 | auVar122 & auVar42) & auVar141 | auVar36 & auVar128) & auVar144
                       | auVar34 & auVar133) & auVar146 | auVar28 & auVar113) & auVar142 |
                     auVar18 & auVar126) & auVar138 | auVar12 & auVar123) & auVar134 |
                   auVar2 & auVar120) & auVar129 | auVar143 & auVar117) & auVar132 |
                  auVar139 & auVar114;
      auVar135._8_8_ = uStack_d10;
      auVar135._0_8_ = local_d18;
      local_d38 = ((((((((((((((auVar145 | auVar115 & auVar73) & auVar130 | auVar121 & auVar71) &
                              auVar127 | auVar118 & auVar65) & auVar124 | auVar112 & auVar63) &
                            auVar125 | auVar116 & auVar53) & auVar131 | auVar119 & auVar47) &
                          auVar137 | auVar122 & auVar41) & auVar141 | auVar128 & auVar35) & auVar144
                       | auVar133 & auVar33) & auVar146 | auVar113 & auVar27) & auVar142 |
                     auVar126 & auVar17) & auVar138 | auVar123 & auVar11) & auVar134 |
                   auVar120 & auVar1) & auVar129 | auVar117 & auVar140) & auVar132 |
                  auVar114 & auVar135;
      point_add((uint64_t *)local_778,(uint64_t *)local_778,(uint64_t *)local_d78);
      uVar98 = uVar98 - 4;
    } while (uVar98 != 0xfffffffc);
    point_store(shared_secret,(uint64_t *)local_778);
  }
  return _Var87 && uVar93 == 0xffffffffffffffff;
}

Assistant:

bool
Hacl_Impl_P256_DH_ecp256dh_r(
  uint8_t *shared_secret,
  uint8_t *their_pubkey,
  uint8_t *private_key
)
{
  uint64_t tmp[16U] = { 0U };
  uint64_t *sk = tmp;
  uint64_t *pk = tmp + 4U;
  bool is_pk_valid = load_point_vartime(pk, their_pubkey);
  bn_from_bytes_be4(sk, private_key);
  uint64_t is_b_valid = bn_is_lt_order_and_gt_zero_mask4(sk);
  uint64_t oneq[4U] = { 0U };
  oneq[0U] = 1ULL;
  oneq[1U] = 0ULL;
  oneq[2U] = 0ULL;
  oneq[3U] = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t *os = sk;
    uint64_t uu____0 = oneq[i];
    uint64_t x = uu____0 ^ (is_b_valid & (sk[i] ^ uu____0));
    os[i] = x;);
  uint64_t is_sk_valid = is_b_valid;
  uint64_t ss_proj[12U] = { 0U };
  if (is_pk_valid)
  {
    point_mul(ss_proj, sk, pk);
    point_store(shared_secret, ss_proj);
  }
  return is_sk_valid == 0xFFFFFFFFFFFFFFFFULL && is_pk_valid;
}